

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int regexpTest(char *filename,char *result,char *err,int options)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  FILE *pFVar5;
  char *pcVar6;
  FILE *pFVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  char *__filename;
  ulong uVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  undefined4 in_register_0000000c;
  long lVar15;
  char *extraout_RDX;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  char expression [5000];
  char acStack_4b48 [499];
  undefined1 uStack_4955;
  char acStack_4948 [512];
  char *pcStack_4748;
  char *pcStack_4740;
  code *pcStack_4738;
  undefined8 uStack_4730;
  long lStack_4720;
  FILE *pFStack_4718;
  long lStack_4710;
  char *pcStack_4708;
  long lStack_4700;
  undefined8 uStack_46f8;
  long lStack_46f0;
  undefined8 uStack_46e8;
  char acStack_46e0 [5008];
  long alStack_3350 [1001];
  char *pcStack_1408;
  char *pcStack_1400;
  FILE *pFStack_13f8;
  undefined8 uStack_13f0;
  char *pcStack_13e8;
  undefined8 local_13c0;
  char local_13b8 [5000];
  
  uVar3 = 0;
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler,err,CONCAT44(in_register_0000000c,options))
  ;
  nb_tests = nb_tests + 1;
  pFVar5 = fopen64(filename,"rb");
  if (pFVar5 == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
  }
  else {
    pcVar16 = "";
    pcVar8 = filename;
    local_13c0 = result;
    pcVar6 = resultFilename(filename,"",".res");
    if (pcVar6 == (char *)0x0) {
      regexpTest_cold_2();
      uStack_13f0 = 0;
      nb_tests = nb_tests + 1;
      pcStack_4738 = (code *)0x10be8f;
      pcStack_1408 = filename;
      pcStack_1400 = result;
      pFStack_13f8 = pFVar5;
      pcStack_13e8 = err;
      memset(alStack_3350,0,8000);
      pcStack_4738 = (code *)0x10be9e;
      pFVar5 = fopen64(pcVar8,"rb");
      if (pFVar5 == (FILE *)0x0) {
        pcStack_4738 = (code *)0x10c575;
        fprintf(_stderr,"Cannot open %s for reading\n",pcVar8);
      }
      else {
        pcVar17 = "";
        pcStack_4738 = (code *)0x10bec0;
        pcVar6 = pcVar8;
        __filename = resultFilename(pcVar8,"",".res");
        if (__filename == (char *)0x0) {
          pcStack_4738 = resultFilename;
          automataTest_cold_5();
          pcStack_4748 = pcVar8;
          pcStack_4740 = pcVar16;
          pcStack_4738 = (code *)err;
          pcVar6 = baseFilename(pcVar6);
          pcVar8 = ".tmp";
          if (extraout_RDX != (char *)0x0) {
            pcVar8 = extraout_RDX;
          }
          pcVar16 = "";
          if (pcVar17 != (char *)0x0) {
            pcVar16 = pcVar17;
          }
          strncpy(acStack_4948,pcVar8,499);
          iVar4 = snprintf(acStack_4b48,499,"%s%s%s",pcVar16,pcVar6,acStack_4948);
          if (0x1f2 < iVar4) {
            uStack_4955 = 0;
          }
          pcVar8 = strdup(acStack_4b48);
          return (int)pcVar8;
        }
        pcStack_4738 = (code *)0x10bedb;
        pFVar7 = fopen64(__filename,"wb");
        if (pFVar7 == (FILE *)0x0) {
          pcStack_4738 = (code *)0x10c57f;
          automataTest_cold_4();
        }
        else {
          pcStack_4738 = (code *)0x10beec;
          lVar10 = xmlNewAutomata();
          if (lVar10 == 0) {
            pcStack_4738 = (code *)0x10c589;
            automataTest_cold_3();
          }
          else {
            pcStack_4738 = (code *)0x10bf00;
            alStack_3350[0] = xmlAutomataGetInitState(lVar10);
            if (alStack_3350[0] != 0) {
              lStack_4700 = 0;
              pFStack_4718 = pFVar7;
              pcStack_4708 = pcVar16;
              uStack_46e8 = pcVar8;
LAB_0010bf38:
              lStack_4720 = 0;
LAB_0010bf41:
              uStack_46f8 = 0;
LAB_0010bf4a:
              do {
                pcStack_4738 = (code *)0x10bf5a;
                pcVar8 = fgets(acStack_46e0,0x1194,pFVar5);
                cVar2 = acStack_46e0[0];
                lVar18 = lStack_4720;
                if (pcVar8 == (char *)0x0) {
LAB_0010c5cc:
                  pcVar8 = pcStack_4708;
                  pcStack_4738 = (code *)0x10c5d1;
                  fclose(pFStack_4718);
                  pcStack_4738 = (code *)0x10c5d9;
                  fclose(pFVar5);
                  if (lVar18 != 0) {
                    pcStack_4738 = (code *)0x10c5e6;
                    xmlRegFreeRegexp(lVar18);
                  }
                  if (lStack_4700 != 0) {
                    pcStack_4738 = (code *)0x10c5f5;
                    xmlRegFreeExecCtxt();
                  }
                  if (lVar10 != 0) {
                    pcStack_4738 = (code *)0x10c602;
                    xmlFreeAutomata(lVar10);
                  }
                  pcStack_4738 = (code *)0x10c60d;
                  iVar4 = compareFiles(__filename,pcVar8);
                  if (iVar4 != 0) {
                    pcStack_4738 = (code *)0x10c657;
                    fprintf(_stderr,"Result for %s failed in %s\n",uStack_46e8,pcVar8);
                  }
                  pcStack_4738 = (code *)0x10c61b;
                  unlink(__filename);
                  pcStack_4738 = (code *)0x10c623;
                  free(__filename);
                  return (uint)(iVar4 != 0);
                }
              } while (acStack_46e0[0] == '#');
              pcStack_4738 = (code *)0x10bf76;
              sVar9 = strlen(acStack_46e0);
              if ((int)(uint)sVar9 < 1) {
LAB_0010bf9d:
                acStack_46e0[(int)sVar9] = '\0';
                goto LAB_0010bf4a;
              }
              uVar11 = (ulong)((uint)sVar9 & 0x7fffffff);
              while (((ulong)(byte)acStack_46e0[uVar11 - 1] < 0x21 &&
                     ((0x100002600U >> ((ulong)(byte)acStack_46e0[uVar11 - 1] & 0x3f) & 1) != 0))) {
                sVar9 = uVar11 - 1;
                bVar1 = uVar11 < 2;
                uVar11 = sVar9;
                if (bVar1) goto LAB_0010bf9d;
              }
              acStack_46e0[uVar11 & 0xffffffff] = '\0';
              bVar14 = acStack_46e0[1] ^ 0x20;
              if ((cVar2 == 't' && bVar14 == 0) && lVar10 != 0) {
                if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                  iVar4 = 0;
                  pcVar8 = acStack_46e0 + 2;
                  cVar2 = acStack_46e0[2];
                  do {
                    iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                    cVar2 = pcVar8[1];
                    pcVar8 = pcVar8 + 1;
                  } while ((byte)(cVar2 - 0x30U) < 10);
                  lVar18 = (long)iVar4;
                }
                else {
                  lVar18 = 0;
                  pcVar8 = acStack_46e0 + 2;
                  cVar2 = acStack_46e0[2];
                }
                if (cVar2 == ' ') {
                  lVar12 = alStack_3350[lVar18];
                  if (lVar12 == 0) {
                    pcStack_4738 = (code *)0x10c084;
                    lStack_4710 = lVar18;
                    lVar12 = xmlAutomataNewState(lVar10);
                    alStack_3350[lStack_4710] = lVar12;
                    lVar18 = lStack_4710;
                  }
                  cVar2 = pcVar8[1];
                  if ((byte)(cVar2 - 0x30U) < 10) {
                    iVar4 = 0;
                    do {
                      iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                      cVar2 = pcVar8[2];
                      pcVar8 = pcVar8 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                    lVar15 = (long)iVar4;
                  }
                  else {
                    lVar15 = 0;
                  }
                  if (cVar2 == ' ') {
                    lVar13 = alStack_3350[lVar15];
                    if (lVar13 == 0) {
                      pcStack_4738 = (code *)0x10c15b;
                      lStack_4710 = lVar18;
                      lStack_46f0 = lVar15;
                      lVar13 = xmlAutomataNewState(lVar10,lVar12);
                      alStack_3350[lStack_46f0] = lVar13;
                      lVar12 = alStack_3350[lStack_4710];
                    }
                    pcStack_4738 = (code *)0x10c18a;
                    xmlAutomataNewTransition(lVar10,lVar12,lVar13,pcVar8 + 2);
                    goto LAB_0010bf4a;
                  }
                }
              }
              else {
                if ((cVar2 == 'e' && bVar14 == 0) && lVar10 != 0) {
                  if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                    iVar4 = 0;
                    pcVar8 = acStack_46e0 + 2;
                    cVar2 = acStack_46e0[2];
                    do {
                      iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                      cVar2 = pcVar8[1];
                      pcVar8 = pcVar8 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                    lVar18 = (long)iVar4;
                  }
                  else {
                    lVar18 = 0;
                    pcVar8 = acStack_46e0 + 2;
                    cVar2 = acStack_46e0[2];
                  }
                  if (cVar2 != ' ') goto LAB_0010c5a0;
                  lVar12 = alStack_3350[lVar18];
                  if (lVar12 == 0) {
                    pcStack_4738 = (code *)0x10c1b8;
                    lStack_4710 = lVar18;
                    lVar12 = xmlAutomataNewState(lVar10);
                    alStack_3350[lStack_4710] = lVar12;
                    lVar18 = lStack_4710;
                  }
                  cVar2 = pcVar8[1];
                  if ((byte)(cVar2 - 0x30U) < 10) {
                    pcVar8 = pcVar8 + 2;
                    iVar4 = 0;
                    do {
                      iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                      cVar2 = *pcVar8;
                      pcVar8 = pcVar8 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                    lVar15 = (long)iVar4;
                  }
                  else {
                    lVar15 = 0;
                  }
                  lVar13 = alStack_3350[lVar15];
                  if (lVar13 == 0) {
                    pcStack_4738 = (code *)0x10c264;
                    lStack_4710 = lVar18;
                    lVar13 = xmlAutomataNewState(lVar10,lVar12);
                    alStack_3350[lVar15] = lVar13;
                    lVar12 = alStack_3350[lStack_4710];
                  }
                  pcStack_4738 = (code *)0x10c284;
                  xmlAutomataNewEpsilon(lVar10,lVar12,lVar13);
                  goto LAB_0010bf4a;
                }
                if ((cVar2 == 'f' && bVar14 == 0) && lVar10 != 0) {
                  uVar11 = 0;
                  if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                    uVar11 = 0;
                    pcVar8 = acStack_46e0 + 3;
                    cVar2 = acStack_46e0[2];
                    do {
                      uVar11 = (ulong)((uint)(byte)(cVar2 - 0x30) + (int)uVar11 * 10);
                      cVar2 = *pcVar8;
                      pcVar8 = pcVar8 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                  }
                  if (alStack_3350[(int)uVar11] == 0) {
                    pcStack_4738 = (code *)0x10c67b;
                    fprintf(_stderr,"Bad state %d : %s\n",uVar11,acStack_46e0);
                    lVar18 = lStack_4720;
                    goto LAB_0010c5cc;
                  }
                  pcStack_4738 = (code *)0x10c12d;
                  xmlAutomataSetFinalState(lVar10);
                  goto LAB_0010bf4a;
                }
                if ((cVar2 != 'c' || bVar14 != 0) || lVar10 == 0) {
                  if ((acStack_46e0[1] == 0x2d && cVar2 == '-') && lVar10 != 0) {
                    pcStack_4738 = (code *)0x10c2b3;
                    lVar18 = xmlAutomataCompile(lVar10);
                    pcStack_4738 = (code *)0x10c2be;
                    xmlFreeAutomata(lVar10);
                    lVar10 = 0;
                    lStack_4720 = lVar18;
                    if (lVar18 != 0) goto LAB_0010bf4a;
                    pcStack_4738 = (code *)0x10c685;
                    automataTest_cold_1();
                    lVar10 = 0;
                    lVar18 = 0;
                    goto LAB_0010c5cc;
                  }
                  if (acStack_46e0[1] != 0x3e || cVar2 != '=') {
                    if (lStack_4720 == 0) {
                      pcStack_4738 = (code *)0x10c46e;
                      fprintf(_stderr,"Unexpected line %s\n",acStack_46e0);
                      lStack_4720 = 0;
                    }
                    else {
                      if (lStack_4700 == 0) {
                        pcStack_4738 = (code *)0x10c369;
                        lStack_4700 = xmlRegNewExecCtxt(lStack_4720,0,0);
                      }
                      pcStack_4738 = (code *)0x10c37b;
                      uStack_46f8 = xmlRegExecPushString(lStack_4700,acStack_46e0,0);
                    }
                    goto LAB_0010bf4a;
                  }
                  iVar4 = (int)uStack_46f8;
                  if (lStack_4720 == 0) {
                    pcStack_4738 = (code *)0x10c555;
                    fwrite("=> failed not compiled\n",0x17,1,pFStack_4718);
                    goto LAB_0010bf38;
                  }
                  lVar18 = lStack_4700;
                  if (lStack_4700 == 0) {
                    pcStack_4738 = (code *)0x10c4a7;
                    lVar18 = xmlRegNewExecCtxt(lStack_4720,0,0);
                  }
                  pFVar7 = pFStack_4718;
                  if (iVar4 == 0) {
                    pcStack_4738 = (code *)0x10c4c7;
                    lStack_4700 = lVar18;
                    iVar4 = xmlRegExecPushString(lVar18,0,0);
                    lVar18 = lStack_4700;
                  }
                  if (iVar4 == 1) {
                    sVar9 = 10;
                    pcVar8 = "=> Passed\n";
LAB_0010c519:
                    pcStack_4738 = (code *)0x10c521;
                    fwrite(pcVar8,sVar9,1,pFVar7);
                  }
                  else {
                    if (iVar4 + 1U < 2) {
                      sVar9 = 10;
                      pcVar8 = "=> Failed\n";
                      goto LAB_0010c519;
                    }
                    if (iVar4 < 0) {
                      sVar9 = 9;
                      pcVar8 = "=> Error\n";
                      goto LAB_0010c519;
                    }
                  }
                  pcStack_4738 = (code *)0x10c52c;
                  xmlRegFreeExecCtxt(lVar18);
                  lStack_4700 = 0;
                  goto LAB_0010bf41;
                }
                if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                  iVar4 = 0;
                  pcVar8 = acStack_46e0 + 2;
                  cVar2 = acStack_46e0[2];
                  do {
                    iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                    cVar2 = pcVar8[1];
                    pcVar8 = pcVar8 + 1;
                  } while ((byte)(cVar2 - 0x30U) < 10);
                  lVar18 = (long)iVar4;
                }
                else {
                  lVar18 = 0;
                  pcVar8 = acStack_46e0 + 2;
                  cVar2 = acStack_46e0[2];
                }
                if (cVar2 == ' ') {
                  if (alStack_3350[lVar18] == 0) {
                    pcStack_4738 = (code *)0x10c2fe;
                    lStack_4710 = lVar18;
                    lVar18 = xmlAutomataNewState(lVar10);
                    alStack_3350[lStack_4710] = lVar18;
                    lVar18 = lStack_4710;
                  }
                  cVar2 = pcVar8[1];
                  if ((byte)(cVar2 - 0x30U) < 10) {
                    iVar4 = 0;
                    do {
                      iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                      cVar2 = pcVar8[2];
                      pcVar8 = pcVar8 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                    lVar12 = (long)iVar4;
                  }
                  else {
                    lVar12 = 0;
                  }
                  if (cVar2 != ' ') goto LAB_0010c5a0;
                  lVar15 = alStack_3350[lVar12];
                  if (lVar15 == 0) {
                    pcStack_4738 = (code *)0x10c3ae;
                    lStack_4710 = lVar18;
                    lStack_46f0 = lVar12;
                    lVar15 = xmlAutomataNewState(lVar10);
                    alStack_3350[lStack_46f0] = lVar15;
                    lVar18 = lStack_4710;
                  }
                  cVar2 = pcVar8[2];
                  pcVar8 = pcVar8 + 2;
                  iVar4 = 0;
                  if ((byte)(cVar2 - 0x30U) < 10) {
                    iVar4 = 0;
                    do {
                      iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                      cVar2 = pcVar8[1];
                      pcVar8 = pcVar8 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                  }
                  if (cVar2 != ' ') goto LAB_0010c5a0;
                  cVar2 = pcVar8[1];
                  iVar19 = 0;
                  if ((byte)(cVar2 - 0x30U) < 10) {
                    iVar19 = 0;
                    do {
                      iVar19 = (uint)(byte)(cVar2 - 0x30) + iVar19 * 10;
                      cVar2 = pcVar8[2];
                      pcVar8 = pcVar8 + 1;
                    } while ((byte)(cVar2 - 0x30U) < 10);
                  }
                  if (cVar2 == ' ') {
                    uStack_4730 = 0;
                    pcStack_4738 = (code *)0x10c44e;
                    xmlAutomataNewCountTrans
                              (lVar10,alStack_3350[lVar18],lVar15,pcVar8 + 2,iVar4,iVar19);
                    goto LAB_0010bf4a;
                  }
                }
              }
LAB_0010c5a0:
              pcStack_4738 = (code *)0x10c5bd;
              fprintf(_stderr,"Bad line %s\n",acStack_46e0);
              lVar18 = lStack_4720;
              goto LAB_0010c5cc;
            }
            pcStack_4738 = (code *)0x10c596;
            automataTest_cold_2();
          }
        }
      }
      return -1;
    }
    pFVar7 = fopen64(pcVar6,"wb");
    if (pFVar7 != (FILE *)0x0) {
      lVar10 = 0;
LAB_0010bc32:
      do {
        pcVar8 = fgets(local_13b8,0x1194,pFVar5);
        if (pcVar8 == (char *)0x0) goto LAB_0010bd5f;
        sVar9 = strlen(local_13b8);
        if (0 < (int)(uint)sVar9) {
          uVar11 = (ulong)((uint)sVar9 & 0x7fffffff);
          do {
            if ((0x20 < (ulong)(byte)local_13b8[uVar11 - 1]) ||
               ((0x100002600U >> ((ulong)(byte)local_13b8[uVar11 - 1] & 0x3f) & 1) == 0)) {
              local_13b8[uVar11 & 0xffffffff] = '\0';
              if (local_13b8[0] == '#') goto LAB_0010bc32;
              if ((local_13b8[0] == '=') && (local_13b8[1] == '>')) {
                if (lVar10 != 0) {
                  xmlRegFreeRegexp(lVar10);
                }
                pcVar8 = local_13b8 + 2;
                fprintf(pFVar7,"Regexp: %s\n",pcVar8);
              }
              else {
                if (lVar10 != 0) {
                  uVar3 = xmlRegexpExec(lVar10,local_13b8);
                  if (uVar3 == 0) {
                    pcVar8 = "%s: Fail\n";
                  }
                  else {
                    if (uVar3 != 1) {
                      fprintf(pFVar7,"%s: Error: %d\n",local_13b8,(ulong)uVar3);
                      goto LAB_0010bc32;
                    }
                    pcVar8 = "%s: Ok\n";
                  }
                  fprintf(pFVar7,pcVar8,local_13b8);
                  goto LAB_0010bc32;
                }
                fprintf(pFVar7,"Regexp: %s\n",local_13b8);
                pcVar8 = local_13b8;
              }
              lVar10 = xmlRegexpCompile(pcVar8);
              if (lVar10 != 0) goto LAB_0010bc32;
              fwrite("   failed to compile\n",0x15,1,pFVar7);
              lVar10 = 0;
              goto LAB_0010bd5f;
            }
            sVar9 = uVar11 - 1;
            bVar1 = 1 < uVar11;
            uVar11 = sVar9;
          } while (bVar1);
        }
        local_13b8[(int)sVar9] = '\0';
      } while( true );
    }
    regexpTest_cold_1();
    uVar3 = 0;
  }
LAB_0010bdbe:
  xmlSetStructuredErrorFunc(0,0);
  return uVar3;
LAB_0010bd5f:
  fclose(pFVar7);
  fclose(pFVar5);
  if (lVar10 != 0) {
    xmlRegFreeRegexp(lVar10);
  }
  pcVar8 = local_13c0;
  iVar4 = compareFiles(pcVar6,local_13c0);
  if (iVar4 != 0) {
    fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar8);
  }
  uVar3 = (uint)(iVar4 != 0);
  unlink(pcVar6);
  free(pcVar6);
  iVar4 = compareFileMem(err,testErrors,testErrorsSize);
  if (iVar4 != 0) {
    fprintf(_stderr,"Error for %s failed\n",filename);
    uVar3 = 1;
  }
  goto LAB_0010bdbe;
}

Assistant:

static int
regexpTest(const char *filename, const char *result, const char *err,
	   int options ATTRIBUTE_UNUSED) {
    xmlRegexpPtr comp = NULL;
    FILE *input, *output;
    char *temp;
    char expression[5000];
    int len, ret, res = 0;

    /*
     * TODO: Custom error handler for regexp
     */
    xmlSetStructuredErrorFunc(NULL, testStructuredErrorHandler);

    nb_tests++;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	ret = -1;
        goto done;
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	ret = -1;
        goto done;
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    if (expression[0] == '#')
		continue;
	    if ((expression[0] == '=') && (expression[1] == '>')) {
		char *pattern = &expression[2];

		if (comp != NULL) {
		    xmlRegFreeRegexp(comp);
		    comp = NULL;
		}
		fprintf(output, "Regexp: %s\n", pattern) ;
		comp = xmlRegexpCompile((const xmlChar *) pattern);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp == NULL) {
		fprintf(output, "Regexp: %s\n", expression) ;
		comp = xmlRegexpCompile((const xmlChar *) expression);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp != NULL) {
		testRegexp(output, comp, expression);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (comp != NULL)
	xmlRegFreeRegexp(comp);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    ret = compareFileMem(err, testErrors, testErrorsSize);
    if (ret != 0) {
        fprintf(stderr, "Error for %s failed\n", filename);
        res = 1;
    }

done:
    xmlSetStructuredErrorFunc(NULL, NULL);

    return(res);
}